

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O3

int rtosc_arg_vals_eq_single(rtosc_arg_val_t *_lhs,rtosc_arg_val_t *_rhs,rtosc_cmp_options *opt)

{
  double dVar1;
  byte bVar2;
  char *__s1;
  double dVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  char *__s2;
  rtosc_cmp_options *opt_00;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  bVar2 = _lhs->type;
  if (bVar2 != _rhs->type) {
    return 0;
  }
  if (bVar2 < 0x53) {
    if (bVar2 == 0x46) {
      return 1;
    }
    if (bVar2 == 0x49) {
      return 1;
    }
    if (bVar2 == 0x4e) {
      return 1;
    }
switchD_0010ffbd_caseD_65:
    exit(1);
  }
  switch(bVar2) {
  case 0x61:
    cVar4 = rtosc_av_arr_type(_lhs);
    cVar5 = rtosc_av_arr_type(_rhs);
    if ((cVar4 != cVar5) &&
       ((cVar4 = rtosc_av_arr_type(_lhs), cVar4 != 'T' ||
        (cVar4 = rtosc_av_arr_type(_rhs), cVar4 != 'F')))) {
      cVar4 = rtosc_av_arr_type(_lhs);
      if (cVar4 != 'F') {
        return 0;
      }
      cVar4 = rtosc_av_arr_type(_rhs);
      if (cVar4 != 'T') {
        return 0;
      }
    }
    iVar7 = rtosc_av_arr_len(_lhs);
    iVar8 = rtosc_av_arr_len(_rhs);
    iVar6 = rtosc_arg_vals_eq(_lhs + 1,_rhs + 1,(long)iVar7,(long)iVar8,opt_00);
    return iVar6;
  case 0x62:
    if ((_lhs->val).i != (_rhs->val).i) {
      return 0;
    }
    iVar6 = bcmp((_lhs->val).b.data,(_rhs->val).b.data,(long)(_lhs->val).i);
    bVar9 = iVar6 == 0;
    break;
  case 99:
  case 0x69:
  case 0x6d:
  case 0x72:
    bVar9 = (_lhs->val).i == (_rhs->val).i;
    break;
  case 100:
    dVar1 = opt_00->float_tolerance;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar3 = (_lhs->val).d - (_rhs->val).d;
      uVar11 = -(ulong)(dVar3 < -dVar3);
      bVar9 = (double)(~uVar11 & (ulong)dVar3 | (ulong)-dVar3 & uVar11) <= dVar1;
    }
    else {
      bVar9 = (bool)(-((_lhs->val).d == (_rhs->val).d) & 1);
    }
    return (uint)bVar9;
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_0010ffbd_caseD_65;
  case 0x66:
    dVar1 = opt_00->float_tolerance;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      fVar12 = (_lhs->val).f - (_rhs->val).f;
      uVar10 = -(uint)(fVar12 < -fVar12);
      bVar9 = (float)(~uVar10 & (uint)fVar12 | (uint)-fVar12 & uVar10) <= (float)dVar1;
    }
    else {
      bVar9 = (bool)(-((_lhs->val).f == (_rhs->val).f) & 1);
    }
    return (uint)bVar9;
  case 0x68:
  case 0x74:
    bVar9 = (_lhs->val).h == (_rhs->val).h;
    break;
  case 0x73:
    goto switchD_0010ffbd_caseD_73;
  default:
    if (bVar2 != 0x53) {
      if (bVar2 == 0x54) {
        return 1;
      }
      goto switchD_0010ffbd_caseD_65;
    }
switchD_0010ffbd_caseD_73:
    __s1 = (_lhs->val).s;
    __s2 = (_rhs->val).s;
    if (__s1 != (char *)0x0) {
      if (__s2 != (char *)0x0) {
        iVar6 = strcmp(__s1,__s2);
        bVar9 = iVar6 == 0;
        goto LAB_00110178;
      }
      __s2 = (char *)0x0;
    }
    bVar9 = __s1 == __s2;
LAB_00110178:
    return (uint)bVar9;
  }
  return (uint)bVar9;
}

Assistant:

int rtosc_arg_vals_eq_single(const rtosc_arg_val_t* _lhs,
                             const rtosc_arg_val_t* _rhs,
                             const rtosc_cmp_options* opt)
{
#define mfabs(val) (((val) >= 0) ? (val) : -(val))
    int rval;

    if(!opt)
        opt = &default_cmp_options;

    if(_lhs->type == _rhs->type)
    switch(_lhs->type)
    {
        case 'i':
        case 'c':
        case 'r':
            rval = _lhs->val.i == _rhs->val.i;
            break;
        case 'I':
        case 'T':
        case 'F':
        case 'N':
            rval = 1;
            break;
        case 'f':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.f == _rhs->val.f
                   : mfabs(_lhs->val.f - _rhs->val.f) <=
                   (float)opt->float_tolerance;
            break;
        case 'd':
            rval = (opt->float_tolerance == 0.0)
                   ? _lhs->val.d == _rhs->val.d
                   : mfabs(_lhs->val.d - _rhs->val.d) <=
                   opt->float_tolerance;
            break;
        case 'h':
            rval = _lhs->val.h == _rhs->val.h;
            break;
        case 't':
            rval = _lhs->val.t == _rhs->val.t;
            break;
        case 'm':
            rval = 0 == memcmp(_lhs->val.m, _rhs->val.m, 4);
            break;
        case 's':
        case 'S':
            rval = (_lhs->val.s == NULL || _rhs->val.s == NULL)
                 ? _lhs->val.s == _rhs->val.s
                 : (0 == strcmp(_lhs->val.s, _rhs->val.s));
            break;
        case 'b':
        {
            int32_t lbs = _lhs->val.b.len,
                    rbs = _rhs->val.b.len;
            rval = lbs == rbs;
            if(rval)
                rval = 0 == memcmp(_lhs->val.b.data, _rhs->val.b.data, lbs);
            break;
        }
        case 'a':
        {
            if(     rtosc_av_arr_type(_lhs) != rtosc_av_arr_type(_rhs)
               && !(rtosc_av_arr_type(_lhs) == 'T' && rtosc_av_arr_type(_rhs) == 'F')
               && !(rtosc_av_arr_type(_lhs) == 'F' && rtosc_av_arr_type(_rhs) == 'T'))
                rval = 0;
            else
                rval = rtosc_arg_vals_eq(_lhs+1, _rhs+1,
                                         rtosc_av_arr_len(_lhs), rtosc_av_arr_len(_rhs),
                                         opt);
            break;
        }
        default:
            rval = -1;
            // no recovery: the programmer did not pass the right args, and
            // we don't have a function to compare ranges here
            assert(false);
            exit(1);
            break;
    }
    else
    {
        rval = 0;
    }
    return rval;
#undef mfabs
}